

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O0

void sendEventToWM(_GLFWwindow *window,Atom type,long a,long b,long c,long d,long e)

{
  undefined1 local_f8 [8];
  XEvent event;
  long d_local;
  long c_local;
  long b_local;
  long a_local;
  Atom type_local;
  _GLFWwindow *window_local;
  
  event.pad[0x17] = d;
  d_local = c;
  c_local = b;
  b_local = a;
  a_local = type;
  type_local = (Atom)window;
  memset(local_f8,0,0xc0);
  local_f8._0_4_ = 0x21;
  event.xany.display = (Display *)*(undefined8 *)(type_local + 0x360);
  event.xfocus.mode = 0x20;
  event.pad[4] = a_local;
  event.pad[6] = b_local;
  event.pad[7] = c_local;
  event.pad[8] = d_local;
  event.xconfigure.above = event.pad[0x17];
  event.pad[10] = e;
  (*_glfw.x11.xlib.SendEvent)(_glfw.x11.display,_glfw.x11.root,0,0x180000,(XEvent *)local_f8);
  return;
}

Assistant:

static void sendEventToWM(_GLFWwindow* window, Atom type,
                          long a, long b, long c, long d, long e)
{
    XEvent event = { ClientMessage };
    event.xclient.window = window->x11.handle;
    event.xclient.format = 32; // Data is 32-bit longs
    event.xclient.message_type = type;
    event.xclient.data.l[0] = a;
    event.xclient.data.l[1] = b;
    event.xclient.data.l[2] = c;
    event.xclient.data.l[3] = d;
    event.xclient.data.l[4] = e;

    XSendEvent(_glfw.x11.display, _glfw.x11.root,
               False,
               SubstructureNotifyMask | SubstructureRedirectMask,
               &event);
}